

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::p_1(disp *this,int x)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int in_stack_0000016c;
  string *__lhs;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = local_50;
  to_string<int>(in_stack_0000016c);
  std::operator+((char *)__lhs,in_RDI);
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_string_length,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void p_1(int x) { v_="p_1:" + to_string(x); }